

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator*(unsigned_long lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  long ret;
  long local_20;
  long local_18;
  unsigned_long local_10;
  
  local_18 = 0;
  local_20 = rhs.m_int;
  local_10 = lhs;
  MultiplicationHelper<long,_unsigned_long,_15>::
  MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_20,&local_10,&local_18)
  ;
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_18;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY SafeInt< T, E > operator *( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    T ret( 0 );
    MultiplicationHelper< T, U, MultiplicationMethod< T, U >::method >::template MultiplyThrow< E >( (T)rhs, lhs, ret );
    return SafeInt< T, E >(ret);
}